

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

type __thiscall
boost::spirit::classic::
action<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::Initialize>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (action<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::Initialize>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  return_t actor;
  type first;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *last;
  action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
  *in_RSI;
  nil_t *in_RDI;
  return_t val;
  iterator_t save;
  result_t hit;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff68;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff70;
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  *in_stack_ffffffffffffffe0;
  match<boost::spirit::classic::nil_t> local_8;
  
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  ::at_end((scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
            *)0xa651c1);
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  actor = unary<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::Initialize>_>_>
          ::subject((unary<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_boost::spirit::classic::parser<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::epsilon_parser,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,_POMDPFormatParsing::ParserPOMDPFormat_Spirit::Initialize>_>_>
                     *)in_RDI);
  first = action<boost::spirit::classic::epsilon_parser,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
          ::
          parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                    (in_RSI,in_stack_ffffffffffffffe0);
  local_8.len = first.len;
  last = (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
          *)safe_bool::operator_cast_to__
                      ((safe_bool<boost::spirit::classic::match<boost::spirit::classic::nil_t>,_boost::spirit::classic::impl::no_base<boost::spirit::classic::match<boost::spirit::classic::nil_t>_>_>
                        *)0xa6521b);
  if (last != (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
               *)0xffffffffffffffff) {
    match<boost::spirit::classic::nil_t>::value(&local_8);
    action_policy::
    do_action<POMDPFormatParsing::ParserPOMDPFormat_Spirit::Initialize,boost::spirit::classic::nil_t,boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>>
              ((action_policy *)in_stack_ffffffffffffff70,(Initialize *)actor,in_RDI,
               (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                *)first.len,last);
  }
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(last);
  return (type)local_8.len;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename ScannerT::iterator_t iterator_t;
            typedef typename parser_result<self_t, ScannerT>::type result_t;

            scan.at_end(); // allow skipper to take effect
            iterator_t save = scan.first;
            result_t hit = this->subject().parse(scan);
            if (hit)
            {
                typename result_t::return_t val = hit.value();
                scan.do_action(actor, val, save, scan.first);
            }
            return hit;
        }